

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem_parser.cpp
# Opt level: O0

void __thiscall franca::TypeParser::TypeParser(TypeParser *this)

{
  adder *paVar1;
  char local_fb1;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_fb0;
  expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>
  local_fa0;
  char local_f91;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_f90;
  bool_<false> local_f7b;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  local_f7a;
  expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>
  local_f78;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  local_f70;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  local_f60;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&>,_2L>
  local_f50;
  char local_f39;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_f38;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::raw>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  local_f28;
  BuiltinType local_f18 [15];
  char local_ed9;
  longlong local_ed8;
  type local_ed0;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>
  local_ec0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>
  local_eb0;
  char local_e99;
  longlong local_e98;
  type local_e90;
  char *local_e80;
  type *local_e78;
  undefined1 *local_e70;
  char **local_e68;
  undefined1 local_e59;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  local_e58;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_e48;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  local_e38;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  local_e28;
  type local_e18;
  expr<_edc62cbd_> local_e08;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_&>,_2L>
  local_df8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_&>,_2L>_&,_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_de8;
  allocator local_dd1;
  string local_dd0;
  allocator local_da9;
  string local_da8;
  allocator local_d81;
  string local_d80;
  allocator local_d59;
  string local_d58;
  allocator local_d31;
  string local_d30;
  allocator local_d09;
  string local_d08;
  allocator local_cd1;
  string local_cd0;
  TypeParser *local_cb0;
  TypeParser *this_local;
  Rule<std::string_()> *local_ca0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_&>,_2L>
  *local_c98;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::qi::symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>_&>,_2L>
  *local_c90;
  Rule<std::string_()> *local_c88;
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  *local_c78;
  Rule<ast::IntegerInterval_()> *local_c70;
  Rule<ast::IntegerInterval_()> *local_c68;
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  *local_c60;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_c50;
  type *local_c48;
  type *local_c40;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_c38;
  char *local_c28;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  *local_c20;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>
  *local_c18;
  char *local_c10;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>
  *local_c00;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_bf8;
  expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>_&>,_2L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_bf0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::spirit::terminal<boost::spirit::tag::long_long>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::attr,_boost::fusion::vector<long_long>_>_>,_0L>_&>,_2L>_&>,_2L>
  *local_be8;
  proto_child0 local_bd8;
  proto_child0 local_bd0;
  proto_child0 local_bc8;
  proto_child0 local_bc0;
  undefined1 **local_bb0;
  undefined1 *local_ba8;
  undefined1 *local_ba0;
  undefined1 **local_b98;
  proto_child1 local_b88;
  undefined1 *local_b80;
  proto_child0 local_b78;
  proto_child1 local_b70;
  char **local_b60;
  undefined1 *local_b58;
  undefined1 *local_b50;
  char **local_b48;
  type *local_b38;
  char *local_b30;
  char *local_b28;
  type *local_b20;
  type *local_b10;
  char *local_b08;
  char *local_b00;
  type *local_af8;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_af0;
  undefined1 *local_ae8;
  undefined1 *local_ae0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::raw>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>
  that_18;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::lexeme>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>_&>,_2L>
  that_27;
  expr_type that;
  expr_type that_1;
  expr_type that_2;
  expr_type that_9;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_(&)[7]>,_0L>
  that_3;
  expr_type that_4;
  expr_type that_11;
  expr_type that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_6;
  expr_type that_7;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_8;
  expr_type that_12;
  expr_type that_13;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_14;
  expr_type that_15;
  expr_type that_16;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_17;
  undefined1 local_309;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_308;
  expr<boost::proto::tagns_::tag::modulus,_boost::proto::argsns_::list2<boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>
  *local_300;
  undefined1 *local_2f8;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  *local_2e8;
  expr_type that_19;
  expr_type that_20;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_21;
  expr_type that_22;
  expr_type that_23;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L> that_24;
  expr_type that_25;
  expr_type that_26;
  undefined1 local_21;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  *local_20;
  expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>_&>,_1L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,_boost::proto::argsns_::list1<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,_boost::spirit::char_encoding::standard>_>,_0L>_&,_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<const_char_&>,_0L>_>,_2L>_&>,_1L>_&>,_2L>
  *local_18;
  undefined1 *local_10;
  
  local_cb0 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_cd0,"unnamed-grammar",&local_cd1);
  boost::spirit::qi::
  grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->
             super_grammar<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
            ,&this->type_,&local_cd0);
  std::__cxx11::string::~string((string *)&local_cd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d08,"unnamed-rule",&local_d09);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_,&local_d08);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d30,"unnamed-rule",&local_d31);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_ref_,&local_d30);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator((allocator<char> *)&local_d31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d58,"unnamed-rule",&local_d59);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->integer_interval_,&local_d58);
  std::__cxx11::string::~string((string *)&local_d58);
  std::allocator<char>::~allocator((allocator<char> *)&local_d59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d80,"symbols",&local_d81);
  boost::spirit::qi::
  symbols<char,_fidler::ast::BuiltinType,_boost::spirit::qi::tst<char,_fidler::ast::BuiltinType>,_boost::spirit::qi::tst_pass_through>
  ::symbols(&this->builtin_type_,&local_d80);
  std::__cxx11::string::~string((string *)&local_d80);
  std::allocator<char>::~allocator((allocator<char> *)&local_d81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_da8,"unnamed-rule",&local_da9);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->fqn_,&local_da8);
  std::__cxx11::string::~string((string *)&local_da8);
  std::allocator<char>::~allocator((allocator<char> *)&local_da9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_dd0,"unnamed-rule",&local_dd1);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->id_,&local_dd0);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
  local_df8.child0 = &this->integer_interval_;
  local_df8.child1 = &this->builtin_type_;
  local_de8.child1 = &this->fqn_;
  local_de8.child0 = &local_df8;
  local_ca0 = local_de8.child1;
  local_c98 = local_de8.child0;
  local_c90 = local_de8.child0;
  local_c88 = local_de8.child1;
  local_c78 = local_df8.child1;
  local_c70 = local_df8.child0;
  local_c68 = local_df8.child0;
  local_c60 = local_df8.child1;
  boost::spirit::qi::operator%=(&this->type_,&local_de8);
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_e18,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [8])"Integer",(is_false)0x0);
  local_e59 = 0x28;
  local_e98 = -0x8000000000000000;
  boost::spirit::terminal<boost::spirit::tag::attr>::operator()
            (&local_e90,(terminal<boost::spirit::tag::attr> *)&boost::spirit::attr,&local_e98,
             (is_false)0x0);
  local_b08 = "minInt";
  local_e78 = &local_e90;
  local_e80 = "minInt";
  local_b58 = &boost::spirit::long_long;
  local_e68 = &local_e80;
  local_e70 = &boost::spirit::long_long;
  local_e58.child0.child0 = &local_e59;
  local_e58.child1 = (proto_child1)&local_e70;
  local_e99 = ',';
  local_e48.child0 = &local_e58;
  local_e48.child1.child0 = &local_e99;
  local_ed8 = 0x7fffffffffffffff;
  local_bd8 = local_e48.child1.child0;
  local_bd0 = local_e48.child0;
  local_bc8 = local_e48.child0;
  local_bc0 = local_e48.child1.child0;
  local_bb0 = (undefined1 **)local_e58.child1;
  local_ba8 = local_e58.child0.child0;
  local_ba0 = local_e58.child0.child0;
  local_b98 = (undefined1 **)local_e58.child1;
  local_b60 = local_e68;
  local_b50 = local_e70;
  local_b48 = local_e68;
  local_b10 = local_e78;
  local_b00 = local_e80;
  local_af8 = local_e78;
  boost::spirit::terminal<boost::spirit::tag::attr>::operator()
            (&local_ed0,(terminal<boost::spirit::tag::attr> *)&boost::spirit::attr,&local_ed8,
             (is_false)0x0);
  local_b30 = "maxInt";
  local_ec0.child1 = &local_ed0;
  local_ec0.child0.child0 = (proto_child0)0x147b510;
  local_b80 = &boost::spirit::long_long;
  local_eb0.child1 = &local_ec0;
  local_eb0.child0 = (proto_child0)&boost::spirit::long_long;
  local_e38.child0 = &local_e48;
  local_e38.child1 = &local_eb0;
  local_ed9 = ')';
  local_e28.child0 = &local_e38;
  local_e28.child1.child0 = &local_ed9;
  local_e08.child0 = &local_e18;
  local_e08.child1 = &local_e28;
  local_c50 = local_e08.child1;
  local_c48 = local_e08.child0;
  local_c40 = local_e08.child0;
  local_c38 = local_e08.child1;
  local_c28 = local_e28.child1.child0;
  local_c20 = local_e28.child0;
  local_c18 = local_e28.child0;
  local_c10 = local_e28.child1.child0;
  local_c00 = local_e38.child1;
  local_bf8 = local_e38.child0;
  local_bf0 = local_e38.child0;
  local_be8 = local_e38.child1;
  local_b88 = local_eb0.child1;
  local_b78 = local_eb0.child0;
  local_b70 = local_eb0.child1;
  local_b38 = local_ec0.child1;
  local_b28 = *local_ec0.child0.child0;
  local_b20 = local_ec0.child1;
  boost::spirit::qi::operator%=(&this->integer_interval_,&local_e08);
  local_f18[0xe] = 0;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(&(this->builtin_type_).add,(char (*) [10])"undefined",local_f18 + 0xe
                              );
  local_f18[0xd] = 1;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [5])0x1479b6c,local_f18 + 0xd);
  local_f18[0xc] = 2;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [6])"UInt8",local_f18 + 0xc);
  local_f18[0xb] = 3;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [6])0x1479b72,local_f18 + 0xb);
  local_f18[10] = 4;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [7])"UInt16",local_f18 + 10);
  local_f18[9] = 5;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [6])0x1479b79,local_f18 + 9);
  local_f18[8] = 6;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [7])"UInt32",local_f18 + 8);
  local_f18[7] = 7;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [6])0x1479b80,local_f18 + 7);
  local_f18[6] = 8;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [7])"UInt64",local_f18 + 6);
  local_f18[5] = 9;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [8])"Boolean",local_f18 + 5);
  local_f18[4] = 10;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [7])"String",local_f18 + 4);
  local_f18[3] = 0xb;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [6])"Float",local_f18 + 3);
  local_f18[2] = 0xc;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [7])"Double",local_f18 + 2);
  local_f18[1] = 0xd;
  paVar1 = boost::spirit::qi::
           symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
           ::adder::operator()(paVar1,(char (*) [11])"ByteBuffer",local_f18 + 1);
  local_f18[0] = Int32;
  boost::spirit::qi::
  symbols<char,fidler::ast::BuiltinType,boost::spirit::qi::tst<char,fidler::ast::BuiltinType>,boost::spirit::qi::tst_pass_through>
  ::adder::operator()(paVar1,(char (*) [8])"Integer",local_f18);
  local_f38.child0 = &this->id_;
  local_f39 = '.';
  local_f38.child1.child0 = &local_f39;
  local_ae8 = &boost::spirit::raw;
  local_f28.child1 = &local_f38;
  local_ae0 = &boost::spirit::raw;
  local_2f8 = &local_309;
  local_f28.child0 = (proto_child0)&boost::spirit::raw;
  local_af0 = local_f28.child1;
  local_308 = local_f28.child1;
  local_300 = local_f28.child1;
  boost::spirit::qi::operator%=(&this->fqn_,&local_f28);
  local_f7b = (bool_<false>)0x5e;
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            ((terminal<boost::spirit::tag::lit> *)&local_f7a,&boost::spirit::lit,&local_f7b);
  local_f78.child0 = &local_f7a;
  local_f91 = '_';
  local_f90.child1.child0 = &local_f91;
  local_f90.child0 = (proto_child0)&boost::spirit::standard::alpha;
  local_f70.child0 = &local_f78;
  local_f70.child1 = &local_f90;
  local_fb1 = '_';
  local_fb0.child1.child0 = &local_fb1;
  local_fb0.child0 = (proto_child0)&boost::spirit::standard::alnum;
  local_fa0.child0 = &local_fb0;
  local_f60.child0 = &local_f70;
  local_f60.child1 = &local_fa0;
  local_f50.child1 = &local_f60;
  local_10 = &local_21;
  local_f50.child0 = (proto_child0)&boost::spirit::lexeme;
  local_2e8 = local_f78.child0;
  that_19.child0 = local_f78.child0;
  local_20 = local_f50.child1;
  local_18 = local_f50.child1;
  boost::spirit::qi::operator%=(&this->id_,&local_f50);
  return;
}

Assistant:

TypeParser::TypeParser() :
		TypeParser::base_type(type_)
{
	namespace qi = boost::spirit::qi;

	type_
		%= integer_interval_
		| builtin_type_
		| fqn_
		;

	integer_interval_
		%= qi::lit("Integer")
		>> ( '('
		   > (qi::long_long | "minInt" >> qi::attr(LLONG_MIN))
		   > ','
		   > (qi::long_long | "maxInt" >> qi::attr(LLONG_MAX))
		   > ')'
		   )
		;

	builtin_type_.add
		("undefined",  ast::BuiltinType::undefined)
		("Int8",       ast::BuiltinType::Int8)
		("UInt8",      ast::BuiltinType::UInt8)
		("Int16",      ast::BuiltinType::Int16)
		("UInt16",     ast::BuiltinType::UInt16)
		("Int32",      ast::BuiltinType::Int32)
		("UInt32",     ast::BuiltinType::UInt32)
		("Int64",      ast::BuiltinType::Int64)
		("UInt64",     ast::BuiltinType::UInt64)
		("Boolean",    ast::BuiltinType::Boolean)
		("String",     ast::BuiltinType::String)
		("Float",      ast::BuiltinType::Float)
		("Double",     ast::BuiltinType::Double)
		("ByteBuffer", ast::BuiltinType::ByteBuffer)
		("Integer",    ast::BuiltinType::Int32)
		;

	fqn_
		%= qi::raw[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | '_') >> *(qi::alnum | '_')]
		;
}